

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void place_gold(chunk_conflict *c,loc grid,wchar_t level,uint8_t origin)

{
  _Bool _Var1;
  uint8_t uVar2;
  _Bool local_29;
  object *poStack_28;
  _Bool dummy;
  object *money;
  uint8_t origin_local;
  chunk *pcStack_18;
  wchar_t level_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  poStack_28 = (object *)0x0;
  local_29 = true;
  money._3_1_ = origin;
  money._4_4_ = level;
  pcStack_18 = (chunk *)c;
  c_local = (chunk_conflict *)grid;
  _Var1 = square_in_bounds((chunk *)c,(loc_conflict)grid);
  if ((_Var1) && (_Var1 = square_canputitem(pcStack_18,(loc_conflict)c_local), _Var1)) {
    poStack_28 = make_gold(money._4_4_,"any");
    poStack_28->origin = money._3_1_;
    uVar2 = convert_depth_to_origin(money._4_4_);
    poStack_28->origin_depth = uVar2;
    _Var1 = floor_carry(pcStack_18,(loc_conflict)c_local,poStack_28,&local_29);
    if (_Var1) {
      list_object((chunk_conflict *)pcStack_18,poStack_28);
    }
    else {
      object_delete(pcStack_18,(chunk *)0x0,&stack0xffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void place_gold(struct chunk *c, struct loc grid, int level, uint8_t origin)
{
	struct object *money = NULL;
	bool dummy = true;

	if (!square_in_bounds(c, grid)) return;
	if (!square_canputitem(c, grid)) return;

	money = make_gold(level, "any");
	money->origin = origin;
	money->origin_depth = convert_depth_to_origin(level);

	if (!floor_carry(c, grid, money, &dummy)) {
		object_delete(c, NULL, &money);
	} else {
		list_object(c, money);
	}
}